

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

Belief * __thiscall despot::POMDPX::InitialBelief(POMDPX *this,State *start,string *type)

{
  bool bVar1;
  POMDPXBelief *this_00;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> *this_01;
  double dVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_60;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_30;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->is_small_ == true) {
    dVar2 = Parser::LogNumInitialStates(this->parser_);
    if (dVar2 < 13.0) {
      ExactInitialParticleSet
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_60,this);
      goto LAB_00167d31;
    }
  }
  ApproxInitialParticleSet
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_60,this);
LAB_00167d31:
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign
            (&particles,&local_60);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_60);
  bVar1 = std::operator==(type,"noisy");
  if (bVar1) {
    this_00 = (POMDPXBelief *)operator_new(0xa0);
    this_01 = &local_30;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_01,&particles);
    POMDPXBelief::POMDPXBelief
              (this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_01,10,
               &this->super_DSPOMDP,(Belief *)0x0);
  }
  else {
    this_00 = (POMDPXBelief *)operator_new(0x90);
    this_01 = &local_48;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_01,&particles);
    ParticleBelief::ParticleBelief
              ((ParticleBelief *)this_00,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_01,
               &this->super_DSPOMDP,(Belief *)0x0,true);
  }
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(this_01);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return (Belief *)this_00;
}

Assistant:

Belief* POMDPX::InitialBelief(const State* start, string type) const {
	vector<State*> particles;
	if (is_small_ && parser_->LogNumInitialStates() < 13) { // Small problem
		particles = ExactInitialParticleSet();
	} else {
		particles = ApproxInitialParticleSet();
	}

	Belief* belief = NULL;
	if (type == "noisy")
		belief = new POMDPXBelief(particles, 10, this);
	else // if (type == "particle")
		belief = new ParticleBelief(particles, this);
	return belief;
}